

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int test_symlink_dir_impl(int type)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uv_loop_t *puVar5;
  uv_dirent_t dent_00;
  uv_dirent_t dent_01;
  size_t local_1f0;
  size_t test_dir_abs_size;
  uv_dirent_t dent;
  char *test_dir;
  undefined1 local_1c8 [4];
  int r;
  uv_fs_t req;
  int type_local;
  
  req.bufsml[3].len._0_4_ = type;
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");
  local_1f0 = 0x1000;
  loop = uv_default_loop();
  uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir",0x1ff,(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  uv_cwd(test_symlink_dir_impl::test_dir_abs_buf,&local_1f0);
  strcat(test_symlink_dir_impl::test_dir_abs_buf,"/test_dir");
  local_1f0 = local_1f0 + 9;
  dent._8_8_ = (long)"/test_dir" + 1;
  uVar2 = uv_fs_symlink((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir","test_dir_symlink",
                        (int)req.bufsml[3].len,(uv_fs_cb)0x0);
  if (((int)req.bufsml[3].len == 1) && ((uVar2 == 0xffffffa1 || (uVar2 == 0xffffffff)))) {
    uv_fs_req_cleanup((uv_fs_t *)local_1c8);
    fprintf(_stderr,"%s\n",
            "this version of Windows doesn\'t support unprivileged creation of directory symlinks");
    fflush(_stderr);
    req.bufsml[3].len._4_4_ = 1;
  }
  else {
    fprintf(_stderr,"r == %i\n",(ulong)uVar2);
    if (uVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x8ee,"r == 0");
      abort();
    }
    if (req.cb != (uv_fs_cb)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x8ef,"req.result == 0");
      abort();
    }
    uv_fs_req_cleanup((uv_fs_t *)local_1c8);
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir_symlink",(uv_fs_cb)0x0);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x8f3,"r == 0");
      abort();
    }
    if ((*(ulong *)(req.result + 8) & 0x4000) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x8f4,"((uv_stat_t*)req.ptr)->st_mode & S_IFDIR");
      abort();
    }
    uv_fs_req_cleanup((uv_fs_t *)local_1c8);
    iVar3 = uv_fs_lstat((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir_symlink",(uv_fs_cb)0x0);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x8f8,"r == 0");
      abort();
    }
    if ((*(ulong *)(req.result + 8) & 0xa000) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x8fc,"((uv_stat_t*)req.ptr)->st_mode & S_IFLNK");
      abort();
    }
    sVar1 = *(size_t *)(req.result + 0x38);
    sVar4 = strlen((char *)dent._8_8_);
    if (sVar1 != sVar4) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x904,"((uv_stat_t*)req.ptr)->st_size == strlen(test_dir)");
      abort();
    }
    uv_fs_req_cleanup((uv_fs_t *)local_1c8);
    iVar3 = uv_fs_readlink((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir_symlink",(uv_fs_cb)0x0);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x90a,"r == 0");
      abort();
    }
    iVar3 = strcmp((char *)req.result,(char *)dent._8_8_);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x90e,"strcmp(req.ptr, test_dir) == 0");
      abort();
    }
    uv_fs_req_cleanup((uv_fs_t *)local_1c8);
    iVar3 = uv_fs_realpath((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir_symlink",(uv_fs_cb)0x0);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x91c,"r == 0");
      abort();
    }
    iVar3 = strcmp((char *)req.result,test_symlink_dir_impl::test_dir_abs_buf);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x921,"strcmp(req.ptr, test_dir_abs_buf) == 0");
      abort();
    }
    uv_fs_req_cleanup((uv_fs_t *)local_1c8);
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar3 < 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x927,"r >= 0");
      abort();
    }
    uv_fs_req_cleanup(&open_req1);
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x92a,"r == 0");
      abort();
    }
    uv_fs_req_cleanup(&close_req);
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar3 < 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x92f,"r >= 0");
      abort();
    }
    uv_fs_req_cleanup(&open_req1);
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x932,"r == 0");
      abort();
    }
    uv_fs_req_cleanup(&close_req);
    iVar3 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir_symlink",0,(uv_fs_cb)0x0);
    if (iVar3 != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x936,"r == 2");
      abort();
    }
    if (scandir_req.result != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x937,"scandir_req.result == 2");
      abort();
    }
    if (scandir_req.ptr == (void *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x938,"scandir_req.ptr");
      abort();
    }
    while (iVar3 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)&test_dir_abs_size),
          iVar3 != -0xfff) {
      iVar3 = strcmp((char *)test_dir_abs_size,"file1");
      if ((iVar3 != 0) && (iVar3 = strcmp((char *)test_dir_abs_size,"file2"), iVar3 != 0)) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
                ,0x93a,"strcmp(dent.name, \"file1\") == 0 || strcmp(dent.name, \"file2\") == 0");
        abort();
      }
      dent_00.type = dent.name._0_4_;
      dent_00.name = (char *)test_dir_abs_size;
      dent_00._12_4_ = 0;
      assert_is_file_type(dent_00);
    }
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x93e,"!scandir_req.ptr");
      abort();
    }
    iVar3 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir_symlink",(uv_fs_cb)0x0);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x942,"r == 0");
      abort();
    }
    uv_fs_req_cleanup((uv_fs_t *)local_1c8);
    iVar3 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir_symlink",0,(uv_fs_cb)0x0);
    if (iVar3 != -2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x946,"r == UV_ENOENT");
      abort();
    }
    uv_fs_req_cleanup(&scandir_req);
    iVar3 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir",0,(uv_fs_cb)0x0);
    if (iVar3 != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x94a,"r == 2");
      abort();
    }
    if (scandir_req.result != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x94b,"scandir_req.result == 2");
      abort();
    }
    if (scandir_req.ptr == (void *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x94c,"scandir_req.ptr");
      abort();
    }
    while (iVar3 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)&test_dir_abs_size),
          iVar3 != -0xfff) {
      iVar3 = strcmp((char *)test_dir_abs_size,"file1");
      if ((iVar3 != 0) && (iVar3 = strcmp((char *)test_dir_abs_size,"file2"), iVar3 != 0)) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
                ,0x94e,"strcmp(dent.name, \"file1\") == 0 || strcmp(dent.name, \"file2\") == 0");
        abort();
      }
      dent_01.type = dent.name._0_4_;
      dent_01.name = (char *)test_dir_abs_size;
      dent_01._12_4_ = 0;
      assert_is_file_type(dent_01);
    }
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x952,"!scandir_req.ptr");
      abort();
    }
    unlink("test_dir/file1");
    unlink("test_dir/file2");
    rmdir("test_dir");
    rmdir("test_dir_symlink");
    puVar5 = uv_default_loop();
    close_loop(puVar5);
    puVar5 = uv_default_loop();
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0x95a,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    uv_library_shutdown();
    req.bufsml[3].len._4_4_ = 0;
  }
  return req.bufsml[3].len._4_4_;
}

Assistant:

int test_symlink_dir_impl(int type) {
  uv_fs_t req;
  int r;
  char* test_dir;
  uv_dirent_t dent;
  static char test_dir_abs_buf[PATHMAX];
  size_t test_dir_abs_size;

  /* set-up */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");
  test_dir_abs_size = sizeof(test_dir_abs_buf);

  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, "test_dir", 0777, NULL);
  uv_fs_req_cleanup(&req);

#ifdef _WIN32
  strcpy(test_dir_abs_buf, "\\\\?\\");
  uv_cwd(test_dir_abs_buf + 4, &test_dir_abs_size);
  test_dir_abs_size += 4;
  strcat(test_dir_abs_buf, "\\test_dir\\");
  test_dir_abs_size += strlen("\\test_dir\\");
  test_dir = test_dir_abs_buf;
#else
  uv_cwd(test_dir_abs_buf, &test_dir_abs_size);
  strcat(test_dir_abs_buf, "/test_dir");
  test_dir_abs_size += strlen("/test_dir");
  test_dir = "test_dir";
#endif

  r = uv_fs_symlink(NULL, &req, test_dir, "test_dir_symlink", type, NULL);
  if (type == UV_FS_SYMLINK_DIR && (r == UV_ENOTSUP || r == UV_EPERM)) {
    uv_fs_req_cleanup(&req);
    RETURN_SKIP("this version of Windows doesn't support unprivileged "
                "creation of directory symlinks");
  }
  fprintf(stderr, "r == %i\n", r);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_stat(NULL, &req, "test_dir_symlink", NULL);
  ASSERT(r == 0);
  ASSERT(((uv_stat_t*)req.ptr)->st_mode & S_IFDIR);
  uv_fs_req_cleanup(&req);

  r = uv_fs_lstat(NULL, &req, "test_dir_symlink", NULL);
  ASSERT(r == 0);
#if defined(__MSYS__)
  RETURN_SKIP("symlink reading is not supported on MSYS2");
#endif
  ASSERT(((uv_stat_t*)req.ptr)->st_mode & S_IFLNK);
#ifdef _WIN32
  ASSERT(((uv_stat_t*)req.ptr)->st_size == strlen(test_dir + 4));
#else
# ifdef __PASE__
  /* On IBMi PASE, st_size returns the length of the symlink itself. */
  ASSERT(((uv_stat_t*)req.ptr)->st_size == strlen("test_dir_symlink"));
# else
  ASSERT(((uv_stat_t*)req.ptr)->st_size == strlen(test_dir));
# endif
#endif
  uv_fs_req_cleanup(&req);

  r = uv_fs_readlink(NULL, &req, "test_dir_symlink", NULL);
  ASSERT(r == 0);
#ifdef _WIN32
  ASSERT(strcmp(req.ptr, test_dir + 4) == 0);
#else
  ASSERT(strcmp(req.ptr, test_dir) == 0);
#endif
  uv_fs_req_cleanup(&req);

  r = uv_fs_realpath(NULL, &req, "test_dir_symlink", NULL);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support GetFinalPathNameByHandleW()
   */
  if (r == UV_ENOSYS) {
    uv_fs_req_cleanup(&req);
    RETURN_SKIP("realpath is not supported on Windows XP");
  }
#endif
  ASSERT(r == 0);
#ifdef _WIN32
  ASSERT(strlen(req.ptr) == test_dir_abs_size - 5);
  ASSERT(strnicmp(req.ptr, test_dir + 4, test_dir_abs_size - 5) == 0);
#else
  ASSERT(strcmp(req.ptr, test_dir_abs_buf) == 0);
#endif
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &open_req1, "test_dir/file1", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_dir/file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_scandir(NULL, &scandir_req, "test_dir_symlink", 0, NULL);
  ASSERT(r == 2);
  ASSERT(scandir_req.result == 2);
  ASSERT(scandir_req.ptr);
  while (UV_EOF != uv_fs_scandir_next(&scandir_req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  uv_fs_req_cleanup(&scandir_req);
  ASSERT(!scandir_req.ptr);

  /* unlink will remove the directory symlink */
  r = uv_fs_unlink(NULL, &req, "test_dir_symlink", NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(NULL, &scandir_req, "test_dir_symlink", 0, NULL);
  ASSERT(r == UV_ENOENT);
  uv_fs_req_cleanup(&scandir_req);

  r = uv_fs_scandir(NULL, &scandir_req, "test_dir", 0, NULL);
  ASSERT(r == 2);
  ASSERT(scandir_req.result == 2);
  ASSERT(scandir_req.ptr);
  while (UV_EOF != uv_fs_scandir_next(&scandir_req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  uv_fs_req_cleanup(&scandir_req);
  ASSERT(!scandir_req.ptr);

  /* clean-up */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");

  MAKE_VALGRIND_HAPPY();
  return 0;
}